

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalBatchCopyToFile::FlushBatchData
          (PhysicalBatchCopyToFile *this,ClientContext *context,GlobalSinkState *gstate_p)

{
  mutex *pmVar1;
  pointer *__mutex;
  iterator __position;
  copy_flush_batch_t p_Var2;
  _Head_base<0UL,_duckdb::PreparedBatchData_*,_false> _Var3;
  type pFVar4;
  type pGVar5;
  pointer pFVar6;
  type pPVar7;
  InternalException *this_00;
  unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>
  batch_data;
  allocator local_79;
  BatchMemoryManager *local_78;
  pointer *local_70;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *local_68;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>>>
  *local_60;
  ClientContext *local_58;
  string local_50;
  
  pmVar1 = &gstate_p[4].super_StateWithBlockableTasks.lock;
  local_58 = context;
  ::std::mutex::lock(pmVar1);
  if ((gstate_p[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[8] & 1U) !=
      0) {
    pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
    return;
  }
  local_78 = (BatchMemoryManager *)(gstate_p + 1);
  LOCK();
  gstate_p[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[8] = '\x01';
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
  LOCK();
  gstate_p[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[8] = '\x01';
  UNLOCK();
  __mutex = &gstate_p[3].super_StateWithBlockableTasks.blocked_tasks.
             super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_60 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>>>
              *)&gstate_p[5].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
                 __list.__next;
  local_68 = &this->bind_data;
  local_70 = &gstate_p[4].super_StateWithBlockableTasks.blocked_tasks.
              super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
              super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  while( true ) {
    batch_data.
    super_unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedPreparedBatchData_*,_std::default_delete<duckdb::FixedPreparedBatchData>_>
    .super__Head_base<0UL,_duckdb::FixedPreparedBatchData_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
          )(__uniq_ptr_data<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true,_true>
            )0x0;
    ::std::mutex::lock((mutex *)__mutex);
    if ((gstate_p[6]._vptr_GlobalSinkState == (_func_int **)0x0) ||
       (__position._M_node =
             (_Base_ptr)
             gstate_p[5].super_StateWithBlockableTasks.blocked_tasks.
             super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,
       *(long *)(__position._M_node + 1) !=
       gstate_p[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align)) break;
    if (*(ulong *)(__position._M_node + 1) <
        (ulong)gstate_p[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_50,"Batch index was out of order!?",&local_79)
      ;
      InternalException::InternalException(this_00,&local_50);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::
    __uniq_ptr_impl<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
    ::operator=((__uniq_ptr_impl<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
                 *)&batch_data,
                (__uniq_ptr_impl<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
                 *)&__position._M_node[1]._M_parent);
    ::std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>>>
    ::erase_abi_cxx11_(local_60,__position);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    p_Var2 = (this->function).flush_batch;
    pFVar4 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator*(local_68);
    pGVar5 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
             ::operator*((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                          *)local_70);
    pFVar6 = unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>
             ::operator->(&batch_data);
    pPVar7 = unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>,_true>
             ::operator*(&pFVar6->prepared_data);
    (*p_Var2)(local_58,pFVar4,pGVar5,pPVar7);
    pFVar6 = unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>
             ::operator->(&batch_data);
    _Var3._M_head_impl =
         (pFVar6->prepared_data).
         super_unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::PreparedBatchData_*,_std::default_delete<duckdb::PreparedBatchData>_>
         .super__Head_base<0UL,_duckdb::PreparedBatchData_*,_false>._M_head_impl;
    (pFVar6->prepared_data).
    super_unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::PreparedBatchData_*,_std::default_delete<duckdb::PreparedBatchData>_>
    .super__Head_base<0UL,_duckdb::PreparedBatchData_*,_false>._M_head_impl =
         (PreparedBatchData *)0x0;
    if (_Var3._M_head_impl != (PreparedBatchData *)0x0) {
      (*(_Var3._M_head_impl)->_vptr_PreparedBatchData[1])();
    }
    pFVar6 = unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>
             ::operator->(&batch_data);
    BatchMemoryManager::ReduceUnflushedMemory(local_78,pFVar6->memory_usage);
    LOCK();
    pmVar1 = &gstate_p[6].super_StateWithBlockableTasks.lock;
    (pmVar1->super___mutex_base)._M_mutex.__align =
         (pmVar1->super___mutex_base)._M_mutex.__align + 1;
    UNLOCK();
    ::std::
    unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
    ::~unique_ptr(&batch_data.
                   super_unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
                 );
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  ::std::
  unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>::
  ~unique_ptr(&batch_data.
               super_unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
             );
  LOCK();
  gstate_p[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[8] = '\0';
  UNLOCK();
  return;
}

Assistant:

void PhysicalBatchCopyToFile::FlushBatchData(ClientContext &context, GlobalSinkState &gstate_p) const {
	auto &gstate = gstate_p.Cast<FixedBatchCopyGlobalState>();
	auto &memory_manager = gstate.memory_manager;

	// flush batch data to disk (if there are any to flush)
	// grab the flush lock - we can only call flush_batch with this lock
	// otherwise the data might end up in the wrong order
	{
		lock_guard<mutex> l(gstate.flush_lock);
		if (gstate.any_flushing) {
			return;
		}
		gstate.any_flushing = true;
	}
	ActiveFlushGuard active_flush(gstate.any_flushing);
	while (true) {
		unique_ptr<FixedPreparedBatchData> batch_data;
		{
			lock_guard<mutex> l(gstate.lock);
			if (gstate.batch_data.empty()) {
				// no batch data left to flush
				break;
			}
			auto entry = gstate.batch_data.begin();
			if (entry->first != gstate.flushed_batch_index) {
				// this entry is not yet ready to be flushed
				break;
			}
			if (entry->first < gstate.flushed_batch_index) {
				throw InternalException("Batch index was out of order!?");
			}
			batch_data = std::move(entry->second);
			gstate.batch_data.erase(entry);
		}
		function.flush_batch(context, *bind_data, *gstate.global_state, *batch_data->prepared_data);
		batch_data->prepared_data.reset();
		memory_manager.ReduceUnflushedMemory(batch_data->memory_usage);
		gstate.flushed_batch_index++;
	}
}